

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcMemberType::IfcMemberType(IfcMemberType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_008f50b0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcMemberType";
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__0095d4f8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x95d3c8;
  *(undefined8 *)&this->field_0x1c0 = 0x95d4e0;
  *(undefined8 *)&this->field_0x88 = 0x95d3f0;
  *(undefined8 *)&this->field_0x98 = 0x95d418;
  *(undefined8 *)&this->field_0xf0 = 0x95d440;
  *(undefined8 *)&this->field_0x148 = 0x95d468;
  *(undefined8 *)&this->field_0x180 = 0x95d490;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x95d4b8;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>).field_0x18
       = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMemberType,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcMemberType() : Object("IfcMemberType") {}